

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O1

void Bbr_StopManager(DdManager *dd)

{
  uint uVar1;
  
  uVar1 = Cudd_CheckZeroRef(dd);
  if (0 < (int)uVar1) {
    printf("\nThe number of referenced nodes = %d\n\n",(ulong)uVar1);
  }
  Cudd_Quit(dd);
  return;
}

Assistant:

void Bbr_StopManager( DdManager * dd )
{
    int RetValue;
    // check for remaining references in the package
    RetValue = Cudd_CheckZeroRef( dd );
    if ( RetValue > 0 )
        printf( "\nThe number of referenced nodes = %d\n\n", RetValue );
//  Cudd_PrintInfo( dd, stdout );
    Cudd_Quit( dd );
}